

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<int,(char)44>
               (char *string_ptr,idx_t string_size,int *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  undefined7 uVar5;
  ulong uVar3;
  ulong uVar4;
  uint uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  duckdb *pdVar11;
  uint8_t uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  short local_52;
  undefined4 local_50;
  DecimalCastData<int> local_4c;
  undefined4 local_3c;
  ulong local_38;
  
  local_4c.result = 0;
  local_4c.digit_count = '\0';
  local_4c.decimal_count = '\0';
  local_4c.round_set = false;
  local_4c.should_round = false;
  local_4c.excessive_decimals = '\0';
  local_4c.exponent_type = NONE;
  local_4c.limit =
       *(StoreType_conflict *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) {
    return false;
  }
  uVar9 = 0;
  while ((bVar1 = string_ptr[uVar9], bVar1 - 9 < 5 || (bVar1 == 0x20))) {
    uVar9 = uVar9 + 1;
    if (string_size == uVar9) {
      return false;
    }
  }
  local_4c.width = width;
  local_4c.scale = scale;
  if (bVar1 == 0x2d) {
    if (string_size - 1 == uVar9) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_4c);
      return false;
    }
    uVar13 = string_size - uVar9;
    uVar7 = 1;
    local_4c.digit_count = 0;
    local_4c.result = 0;
    do {
      bVar1 = string_ptr[uVar9 + uVar7];
      bVar14 = bVar1 - 0x30;
      if (9 < bVar14) {
        local_4c._7_3_ = 0;
        uVar15 = uVar7;
        uVar12 = scale;
        if (bVar1 != 0x2c) goto LAB_014fc01b;
        uVar16 = uVar7 + 1;
        uVar8 = uVar16;
        if (uVar13 <= uVar16) goto LAB_014fc0e7;
        local_3c = 0;
        local_50 = 0;
        local_4c.decimal_count = 0;
        uVar3 = uVar16;
        uVar15 = uVar16;
        goto LAB_014fbde3;
      }
      if (bVar14 == 0 && local_4c.result == 0) {
        local_4c.result = 0;
      }
      else {
        if ((uint)width - (uint)scale == (uint)local_4c.digit_count) {
          return false;
        }
        if (local_4c.result < -0xccccccc) {
          return false;
        }
        local_4c.digit_count = local_4c.digit_count + 1;
        local_4c.result = local_4c.result * 10 - (uint)bVar14;
      }
      uVar8 = uVar13;
      if (~uVar7 + string_size == uVar9) break;
      if (string_ptr[uVar9 + 1 + uVar7] == '_') {
        if ((string_size - uVar7) - 2 == uVar9) {
          return false;
        }
        uVar7 = uVar7 + 2;
        if (9 < (byte)(string_ptr[uVar9 + uVar7] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar7 = uVar7 + 1;
      }
      uVar8 = uVar7;
    } while (uVar7 < uVar13);
    local_4c._7_3_ = 0;
    goto LAB_014fbe9b;
  }
  if (bVar1 == 0x30 && string_size - 1 != uVar9) {
    bVar14 = string_ptr[uVar9 + 1];
    if (bVar14 < 0x62) {
      if ((bVar14 != 0x42) && (bVar14 != 0x58)) goto LAB_014fbcbe;
    }
    else if ((bVar14 != 0x62) && (bVar14 != 0x78)) goto LAB_014fbcbe;
    if ((string_size - uVar9) - 3 < 0xfffffffffffffffe) {
      return false;
    }
LAB_014fbd85:
    DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_4c);
    return false;
  }
LAB_014fbcbe:
  uVar7 = string_size - uVar9;
  uVar13 = (ulong)(bVar1 == 0x2b);
  if (uVar7 <= uVar13) goto LAB_014fbd85;
  local_4c.digit_count = 0;
  local_4c.result = 0;
  uVar15 = uVar13;
  do {
    bVar1 = string_ptr[uVar9 + uVar15];
    bVar14 = bVar1 - 0x30;
    if (9 < bVar14) {
      local_4c._7_3_ = 0;
      uVar16 = uVar15;
      uVar12 = scale;
      if (bVar1 != 0x2c) goto LAB_014fc135;
      uVar8 = uVar15 + 1;
      uVar3 = uVar8;
      if (uVar7 <= uVar8) goto LAB_014fc1f9;
      local_3c = 0;
      local_50 = 0;
      local_4c.decimal_count = 0;
      uVar4 = uVar8;
      uVar16 = uVar8;
      goto LAB_014fbf03;
    }
    if (bVar14 == 0 && local_4c.result == 0) {
      local_4c.result = 0;
    }
    else {
      if ((uint)width - (uint)scale == (uint)local_4c.digit_count) {
        return false;
      }
      if (0xccccccc < local_4c.result) {
        return false;
      }
      local_4c.digit_count = local_4c.digit_count + 1;
      local_4c.result = (uint)bVar14 + local_4c.result * 10;
    }
    uVar3 = uVar7;
    if (~uVar15 + string_size == uVar9) break;
    if (string_ptr[uVar9 + 1 + uVar15] == '_') {
      if ((string_size - uVar15) - 2 == uVar9) {
        return false;
      }
      uVar15 = uVar15 + 2;
      if (9 < (byte)(string_ptr[uVar9 + uVar15] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar15 = uVar15 + 1;
    }
    uVar3 = uVar15;
  } while (uVar15 < uVar7);
  local_4c._7_3_ = 0;
  goto LAB_014fbfb8;
LAB_014fbde3:
  bVar1 = string_ptr[uVar9 + uVar15];
  uVar5 = (undefined7)(uVar3 >> 8);
  bVar14 = bVar1 - 0x30;
  local_38 = uVar16;
  if (9 < bVar14) {
    local_4c.round_set = local_50._0_1_;
    local_4c.should_round = (bool)(char)local_3c;
    uVar12 = uVar16 < uVar15 || 1 < uVar7;
    if (uVar16 >= uVar15 && 1 >= uVar7) {
      return false;
    }
LAB_014fc01b:
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
LAB_014fc031:
      uVar15 = uVar15 + 1;
      uVar8 = uVar15;
      if (uVar15 < uVar13) {
        do {
          if ((4 < (byte)string_ptr[uVar9 + uVar15] - 9) && (string_ptr[uVar9 + uVar15] != 0x20)) {
            return false;
          }
          uVar15 = uVar15 + 1;
          uVar8 = uVar13;
        } while (uVar13 != uVar15);
      }
      goto LAB_014fbe9b;
    }
    if ((bVar1 != 0x65) && (uVar6 != 0x45)) {
      if (uVar6 != 0x20) {
        return false;
      }
      goto LAB_014fc031;
    }
    if (uVar15 == 1) {
      return false;
    }
    if (uVar13 <= uVar15 + 1) {
      return false;
    }
    local_52 = 0;
    pdVar11 = (duckdb *)(string_ptr + uVar9 + uVar15 + 1);
    pcVar10 = (char *)(~uVar9 + (string_size - uVar15));
    if (*pdVar11 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar11,pcVar10,(idx_t)&local_52,(IntegerCastData<short> *)(ulong)bVar1,
                         (bool)uVar12);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar11,pcVar10,(idx_t)&local_52,(IntegerCastData<short> *)(ulong)bVar1,
                         (bool)uVar12);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                      (&local_4c,(int)local_52);
    goto LAB_014fc254;
  }
  if ((local_4c.decimal_count == scale) && (local_50._0_1_ == false)) {
    local_3c = (undefined4)CONCAT71(uVar5,4 < bVar14);
    local_50 = (undefined4)CONCAT71(uVar5,1);
  }
  bVar2 = (uint)local_4c.decimal_count + (uint)local_4c.digit_count < 9;
  if (bVar2) {
    local_4c.result = local_4c.result * 10 - (uint)bVar14;
  }
  local_4c.decimal_count = local_4c.decimal_count + bVar2;
  uVar3 = ~uVar15 + string_size;
  uVar8 = uVar13;
  if (uVar3 != uVar9) goto code_r0x014fbe49;
  goto LAB_014fc0c8;
code_r0x014fbe49:
  if (string_ptr[uVar9 + 1 + uVar15] == '_') {
    if ((string_size - uVar15) - 2 == uVar9) {
      return false;
    }
    uVar15 = uVar15 + 2;
    bVar1 = (string_ptr + uVar15)[uVar9] - 0x30;
    uVar3 = CONCAT71((int7)((ulong)(string_ptr + uVar15) >> 8),bVar1);
    if (9 < bVar1) {
      return false;
    }
  }
  else {
    uVar15 = uVar15 + 1;
  }
  uVar8 = uVar15;
  if (uVar13 <= uVar15) goto LAB_014fc0c8;
  goto LAB_014fbde3;
LAB_014fc0c8:
  local_4c.round_set = SUB41(local_50,0);
  local_4c.should_round = (bool)(char)local_3c;
LAB_014fc0e7:
  if ((uVar7 < 2) && (uVar8 <= uVar16)) {
    return false;
  }
LAB_014fbe9b:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_4c);
  if (!bVar2) {
    return false;
  }
  if (uVar8 < 2) {
    return false;
  }
  goto LAB_014fbfd7;
LAB_014fbf03:
  bVar1 = string_ptr[uVar9 + uVar16];
  uVar5 = (undefined7)(uVar4 >> 8);
  bVar14 = bVar1 - 0x30;
  local_38 = uVar8;
  if (9 < bVar14) {
    local_4c.round_set = local_50._0_1_;
    local_4c.should_round = (bool)(char)local_3c;
    uVar12 = uVar8 < uVar16 || uVar13 < uVar15;
    if (uVar8 >= uVar16 && uVar13 >= uVar15) {
      return false;
    }
LAB_014fc135:
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
    }
    else {
      if ((bVar1 == 0x65) || (uVar6 == 0x45)) {
        if (uVar16 == uVar13) {
          return false;
        }
        if (uVar7 <= uVar16 + 1) {
          return false;
        }
        local_52 = 0;
        pdVar11 = (duckdb *)(string_ptr + uVar9 + uVar16 + 1);
        pcVar10 = (char *)(~uVar9 + (string_size - uVar16));
        if (*pdVar11 == (duckdb)0x2d) {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar11,pcVar10,(idx_t)&local_52,(IntegerCastData<short> *)(ulong)bVar1
                             ,(bool)uVar12);
        }
        else {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar11,pcVar10,(idx_t)&local_52,(IntegerCastData<short> *)(ulong)bVar1
                             ,(bool)uVar12);
        }
        if (bVar2 == false) {
          return false;
        }
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                          (&local_4c,(int)local_52);
LAB_014fc254:
        if (bVar2 == false) {
          return false;
        }
        goto LAB_014fbfd7;
      }
      if (uVar6 != 0x20) {
        return false;
      }
    }
    uVar16 = uVar16 + 1;
    uVar3 = uVar16;
    if (uVar16 < uVar7) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar16] - 9) && (string_ptr[uVar9 + uVar16] != 0x20)) {
          return false;
        }
        uVar16 = uVar16 + 1;
        uVar3 = uVar7;
      } while (uVar7 != uVar16);
    }
    goto LAB_014fbfb8;
  }
  if ((local_4c.decimal_count == scale) && (local_50._0_1_ == false)) {
    local_3c = (undefined4)CONCAT71(uVar5,4 < bVar14);
    local_50 = (undefined4)CONCAT71(uVar5,1);
  }
  bVar2 = (uint)local_4c.decimal_count + (uint)local_4c.digit_count < 9;
  if (bVar2) {
    local_4c.result = (uint)bVar14 + local_4c.result * 10;
  }
  local_4c.decimal_count = local_4c.decimal_count + bVar2;
  uVar4 = ~uVar16 + string_size;
  uVar3 = uVar7;
  if (uVar4 != uVar9) goto code_r0x014fbf66;
  goto LAB_014fc1da;
code_r0x014fbf66:
  if (string_ptr[uVar9 + 1 + uVar16] == '_') {
    if ((string_size - uVar16) - 2 == uVar9) {
      return false;
    }
    uVar16 = uVar16 + 2;
    bVar1 = (string_ptr + uVar16)[uVar9] - 0x30;
    uVar4 = CONCAT71((int7)((ulong)(string_ptr + uVar16) >> 8),bVar1);
    if (9 < bVar1) {
      return false;
    }
  }
  else {
    uVar16 = uVar16 + 1;
  }
  uVar3 = uVar16;
  if (uVar7 <= uVar16) goto LAB_014fc1da;
  goto LAB_014fbf03;
LAB_014fc1da:
  local_4c.round_set = SUB41(local_50,0);
  local_4c.should_round = (bool)(char)local_3c;
LAB_014fc1f9:
  if ((uVar15 <= uVar13) && (uVar3 <= uVar8)) {
    return false;
  }
LAB_014fbfb8:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_4c);
  if (!bVar2) {
    return false;
  }
  if (uVar3 <= uVar13) {
    return false;
  }
LAB_014fbfd7:
  *result = local_4c.result;
  return true;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}